

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall rw::Image::readMasked(Image *this,char *imageName,char *maskName)

{
  int depth;
  Image *this_00;
  Image *this_01;
  size_t __nbytes;
  char *__buf;
  Image *__ptr;
  
  __buf = imageName;
  this_00 = (Image *)read((int)this,imageName,(size_t)maskName);
  if ((imageName != (char *)0x0 && this_00 != (Image *)0x0) && (*imageName != '\0')) {
    this_01 = (Image *)read((int)imageName,__buf,__nbytes);
    if (this_01 != (Image *)0x0) {
      makeMask(this_01);
      depth = this_00->depth;
      __ptr = this_01;
      applyMask(this_00,this_01);
      free(this_01,__ptr);
      (*DAT_00149de0)(this_01);
      numAllocated = numAllocated + -1;
      if ((depth < 9) && (this_00->depth != depth)) {
        palettize(this_00,depth);
      }
    }
  }
  return this_00;
}

Assistant:

Image*
Image::readMasked(const char *imageName, const char *maskName)
{
	Image *img, *mask;

	img = read(imageName);
	if(img == nil)
		return nil;
	if(maskName && maskName[0]){
		mask = read(maskName);
		if(mask == nil)
			return img;
		mask->makeMask();
		int32 origDepth = img->depth;
		img->applyMask(mask);
		mask->destroy();
		if(origDepth <= 8 && img->depth != origDepth)
			img->palettize(origDepth);
	}
	return img;
}